

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx_coro_update(sx_coro_context *ctx,float dt)

{
  sx__coro_state *psVar1;
  code *pcVar2;
  sx_fiber_transfer sVar3;
  sx_fiber_t local_48;
  sx_fiber_t local_38;
  sx__coro_state *next;
  sx__coro_state *fs;
  float dt_local;
  sx_coro_context *ctx_local;
  
  if (ctx->cur_coro != (sx__coro_state *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xf5,"ctx->cur_coro == NULL");
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  psVar1 = ctx->run_list;
  while( true ) {
    while( true ) {
      next = psVar1;
      if (next == (sx__coro_state *)0x0) {
        return;
      }
      psVar1 = next->next;
      if (next->ret_state != CORO_RET_YIELD) break;
      (next->counter).n = (next->counter).n + 1;
      if ((next->arg).n <= (next->counter).n) {
        ctx->cur_coro = next;
        sVar3 = sx_fiber_switch(next->fiber,next->user);
        local_38 = sVar3.from;
        next->fiber = local_38;
      }
    }
    if (next->ret_state != CORO_RET_WAIT) break;
    (next->counter).tm = dt + (next->counter).tm;
    if ((next->arg).tm <= (next->counter).tm) {
      ctx->cur_coro = next;
      sVar3 = sx_fiber_switch(next->fiber,next->user);
      local_48 = sVar3.from;
      next->fiber = local_48;
    }
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                    0x10e,"Invalid ret type in update loop");
  pcVar2 = (code *)swi(3);
  (*pcVar2)();
  return;
}

Assistant:

void sx_coro_update(sx_coro_context* ctx, float dt)
{
    sx_assert(ctx->cur_coro == NULL);

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // Check state and take action for pending fibers
        switch (fs->ret_state) {
        case CORO_RET_YIELD: {
            ++fs->counter.n;
            if (fs->counter.n >= fs->arg.n) {
                ctx->cur_coro = fs;
                fs->fiber = sx_fiber_switch(fs->fiber, fs->user).from;
            }
            break;
        }
        case CORO_RET_WAIT: {
            fs->counter.tm += dt;
            if (fs->counter.tm >= fs->arg.tm) {
                ctx->cur_coro = fs;
                fs->fiber = sx_fiber_switch(fs->fiber, fs->user).from;
            }
            break;
        }
        default:
            sx_assertf(0, "Invalid ret type in update loop");
            break;
        }

        fs = next;
    }
}